

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::StructuredAssignmentPatternExpression::forFixedArray
          (Compilation *comp,StructuredAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Type *elementType,SourceRange sourceRange)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  SyntaxNode *this;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  typeSetters_00;
  bool bVar7;
  int iVar8;
  ConstantRange CVar9;
  ConstantRange CVar10;
  ulong uVar11;
  long lVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  StructuredAssignmentPatternExpression *expr;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar13;
  undefined4 extraout_var_02;
  Expression *pEVar14;
  optional<int> oVar15;
  Diagnostic *diag;
  ulong uVar16;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  undefined1 auVar25 [16];
  SourceRange SVar26;
  Expression *defaultSetter;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL> typeSetters;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL> indexSetters;
  SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  indexMap;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffd48;
  Expression *local_298;
  Expression *local_270;
  char local_268;
  undefined4 local_267;
  undefined3 uStack_263;
  Expression *local_260;
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  local_258;
  ulong local_240;
  SmallVectorBase<const_slang::ast::Expression_*> local_238 [2];
  span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  local_1f8;
  span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  local_1e8;
  uchar local_1d8;
  uchar uStack_1d7;
  uchar uStack_1d6;
  byte bStack_1d5;
  uchar uStack_1d4;
  uchar uStack_1d3;
  uchar uStack_1d2;
  byte bStack_1d1;
  uchar uStack_1d0;
  uchar uStack_1cf;
  uchar uStack_1ce;
  byte bStack_1cd;
  uchar uStack_1cc;
  uchar uStack_1cb;
  uchar uStack_1ca;
  byte bStack_1c9;
  pointer local_1c8;
  size_t sStack_1c0;
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter> local_1b8 [2];
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> local_160 [2];
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_108;
  undefined1 local_f8 [144];
  undefined1 local_68 [24];
  value_type_pointer ppStack_50;
  undefined1 local_48 [16];
  
  local_260 = (Expression *)0x0;
  local_f8._128_8_ = local_f8;
  local_68._0_8_ = 0x3f;
  local_68._8_8_ = 1;
  stack0xffffffffffffffa8 = ZEXT816(0x470b30);
  local_48 = (undefined1  [16])0x0;
  local_160[0].data_ = (pointer)local_160[0].firstElement;
  local_160[0].len = 0;
  local_160[0].cap = 4;
  local_1b8[0].data_ = (pointer)local_1b8[0].firstElement;
  local_298 = (Expression *)0x0;
  local_1b8[0].len = 0;
  local_1b8[0].cap = 4;
  uVar19 = (syntax->items).elements._M_extent._M_extent_value + 1;
  local_240 = 0;
  local_f8._136_8_ = local_f8._128_8_;
  if (1 < uVar19) {
    uVar19 = uVar19 >> 1;
    lVar12 = 0;
    local_298 = (Expression *)0x0;
    uVar11 = 0;
    do {
      ppSVar13 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((long)&(((syntax->items).elements._M_ptr)->super_ConstTokenOrSyntax).
                                    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                            + lVar12));
      pSVar3 = *ppSVar13;
      this = *(SyntaxNode **)(pSVar3 + 1);
      if (this->kind == DefaultPatternKeyExpression) {
        if (local_298 != (Expression *)0x0) {
          SVar26 = slang::syntax::SyntaxNode::sourceRange(this);
          uVar11 = 1;
          ASTContext::addDiag(context,(DiagCode)0xf0007,SVar26);
        }
        local_298 = Expression::selfDetermined
                              (comp,*(ExpressionSyntax **)(pSVar3 + 2),context,
                               (bitmask<slang::ast::ASTFlags>)0x0);
        local_260 = local_298;
        bVar7 = Expression::bad(local_298);
LAB_004100bb:
        local_240 = (ulong)(byte)((byte)uVar11 | bVar7);
      }
      else {
        iVar8 = Expression::bind((int)this,(sockaddr *)context,4);
        pEVar14 = (Expression *)CONCAT44(extraout_var_02,iVar8);
        bVar7 = Expression::bad(pEVar14);
        uVar16 = 1;
        local_240 = uVar16;
        if (!bVar7) {
          if (pEVar14->kind == DataType) {
            CVar10 = (ConstantRange)(pEVar14->type).ptr;
            bVar7 = Type::isSimpleType((Type *)CVar10);
            if (bVar7) {
              auVar6._8_8_ = 0;
              auVar6._0_8_ = context;
              pEVar14 = Expression::bindRValue
                                  ((Expression *)CVar10,*(Type **)(pSVar3 + 2),
                                   (ExpressionSyntax *)0x0,(SourceRange)(auVar6 << 0x40),
                                   (ASTContext *)0x0,in_stack_fffffffffffffd48);
              local_238[0].data_ = (pointer)CVar10;
              local_238[0].len = (size_type)pEVar14;
              SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
              emplace_back<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                        (local_1b8,(TypeSetter *)local_238);
              bVar7 = Expression::bad(pEVar14);
              goto LAB_004100bb;
            }
            SVar26 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(pSVar3 + 1));
            ASTContext::addDiag(context,(DiagCode)0x120007,SVar26);
          }
          else {
            oVar15 = bindArrayIndexSetter
                               (context,pEVar14,elementType,*(ExpressionSyntax **)(pSVar3 + 2),
                                (SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                                 *)local_f8,local_160);
            if (((ulong)oVar15.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
              local_238[0].data_ = (pointer)Type::getFixedRange(type);
              bVar7 = ConstantRange::containsPoint
                                ((ConstantRange *)local_238,
                                 oVar15.super__Optional_base<int,_true,_true>._M_payload.
                                 super__Optional_payload_base<int>._M_payload);
              local_240 = uVar11;
              if (!bVar7) {
                diag = ASTContext::addDiag(context,(DiagCode)0x5c0007,pEVar14->sourceRange);
                local_238[0].data_ =
                     (pointer)(long)oVar15.super__Optional_base<int,_true,_true>._M_payload.
                                    super__Optional_payload_base<int>._M_payload;
                std::
                vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                ::emplace_back<long>(&diag->args,(long *)local_238);
                ast::operator<<(diag,type);
                local_240 = uVar16;
              }
            }
          }
        }
      }
      lVar12 = lVar12 + 0x30;
      uVar19 = uVar19 - 1;
      uVar11 = local_240;
    } while (uVar19 != 0);
  }
  local_238[0].data_ = (pointer)local_238[0].firstElement;
  local_238[0].len = 0;
  local_238[0].cap = 5;
  local_268 = '\0';
  CVar9 = Type::getFixedRange(type);
  iVar20 = CVar9.left;
  CVar10 = (ConstantRange)((ulong)CVar9 >> 0x20);
  iVar8 = iVar20;
  if (CVar9.right < iVar20) {
    CVar10 = CVar9;
    iVar8 = CVar9.right;
  }
  uVar19 = (long)CVar9 >> 0x20;
  if ((long)iVar20 < (long)CVar9 >> 0x20) {
    uVar19 = (long)iVar20;
  }
  iVar20 = (int)uVar19;
  do {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar19;
    uVar16 = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar11 = uVar16 >> (local_68[0] & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar16 & 0xff];
    uVar18 = 0;
    do {
      pgVar1 = (group_type_pointer)(local_68._16_8_ + uVar11 * 0x10);
      local_1d8 = pgVar1->m[0].n;
      uStack_1d7 = pgVar1->m[1].n;
      uStack_1d6 = pgVar1->m[2].n;
      bStack_1d5 = pgVar1->m[3].n;
      uStack_1d4 = pgVar1->m[4].n;
      uStack_1d3 = pgVar1->m[5].n;
      uStack_1d2 = pgVar1->m[6].n;
      bStack_1d1 = pgVar1->m[7].n;
      uStack_1d0 = pgVar1->m[8].n;
      uStack_1cf = pgVar1->m[9].n;
      uStack_1ce = pgVar1->m[10].n;
      bStack_1cd = pgVar1->m[0xb].n;
      uStack_1cc = pgVar1->m[0xc].n;
      uStack_1cb = pgVar1->m[0xd].n;
      uStack_1ca = pgVar1->m[0xe].n;
      bStack_1c9 = pgVar1->m[0xf].n;
      uVar21 = (uchar)uVar2;
      auVar25[0] = -(local_1d8 == uVar21);
      uVar22 = (uchar)((uint)uVar2 >> 8);
      auVar25[1] = -(uStack_1d7 == uVar22);
      uVar23 = (uchar)((uint)uVar2 >> 0x10);
      auVar25[2] = -(uStack_1d6 == uVar23);
      bVar24 = (byte)((uint)uVar2 >> 0x18);
      auVar25[3] = -(bStack_1d5 == bVar24);
      auVar25[4] = -(uStack_1d4 == uVar21);
      auVar25[5] = -(uStack_1d3 == uVar22);
      auVar25[6] = -(uStack_1d2 == uVar23);
      auVar25[7] = -(bStack_1d1 == bVar24);
      auVar25[8] = -(uStack_1d0 == uVar21);
      auVar25[9] = -(uStack_1cf == uVar22);
      auVar25[10] = -(uStack_1ce == uVar23);
      auVar25[0xb] = -(bStack_1cd == bVar24);
      auVar25[0xc] = -(uStack_1cc == uVar21);
      auVar25[0xd] = -(uStack_1cb == uVar22);
      auVar25[0xe] = -(uStack_1ca == uVar23);
      auVar25[0xf] = -(bStack_1c9 == bVar24);
      for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe); uVar17 != 0;
          uVar17 = uVar17 - 1 & uVar17) {
        iVar4 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
          }
        }
        if (*(int *)((long)&ppStack_50[uVar11 * 0xf].first + (ulong)(uint)(iVar4 << 4)) ==
            (int)uVar19) {
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*const&>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)local_238,
                     (Expression **)
                     ((long)&ppStack_50[uVar11 * 0xf].second + (ulong)(uint)(iVar4 << 4)));
          src = extraout_RDX_00;
          goto LAB_0040fefb;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bStack_1c9) == 0) break;
      lVar12 = uVar11 + uVar18;
      uVar18 = uVar18 + 1;
      uVar11 = lVar12 + 1U & local_68._8_8_;
    } while (uVar18 <= (ulong)local_68._8_8_);
    if (local_268 == '\0') {
      SVar26 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      local_1c8 = local_1b8[0].data_;
      sStack_1c0 = local_1b8[0].len;
      typeSetters_00._M_extent._M_extent_value = local_1b8[0].len;
      typeSetters_00._M_ptr = local_1b8[0].data_;
      local_270 = matchElementValue(context,elementType,(FieldSymbol *)0x0,SVar26,typeSetters_00,
                                    local_298);
      local_268 = '\x01';
      local_267 = local_258._M_ptr._0_4_;
      src = (EVP_PKEY_CTX *)(ulong)local_258._M_ptr._3_4_;
      uStack_263 = local_258._M_ptr._4_3_;
      if (local_270 == (Expression *)0x0) {
        uVar11 = 1;
        break;
      }
    }
    SmallVectorBase<slang::ast::Expression_const*>::
    emplace_back<slang::ast::Expression_const*const&>
              ((SmallVectorBase<slang::ast::Expression_const*> *)local_238,&local_270);
    src = extraout_RDX;
LAB_0040fefb:
    uVar19 = uVar19 + 1;
    uVar11 = local_240;
  } while (((iVar20 + CVar10.left) - iVar8) + 1 != (int)uVar19);
  local_258._M_ptr = (pointer)0x0;
  local_258._M_extent._M_extent_value = 0;
  iVar8 = SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::copy
                    (local_1b8,(EVP_PKEY_CTX *)comp,src);
  local_1e8._M_ptr = (pointer)CONCAT44(extraout_var,iVar8);
  iVar8 = SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::copy
                    (local_160,(EVP_PKEY_CTX *)comp,src_00);
  local_1f8._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar8);
  iVar8 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    (local_238,(EVP_PKEY_CTX *)comp,src_01);
  local_108._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar8);
  expr = BumpAllocator::
         emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                   (&comp->super_BumpAllocator,type,&local_258,&local_1e8,&local_1f8,&local_260,
                    &local_108,&sourceRange);
  if ((uVar11 & 1) != 0) {
    expr = (StructuredAssignmentPatternExpression *)Expression::badExpr(comp,(Expression *)expr);
  }
  if (local_238[0].data_ != (pointer)local_238[0].firstElement) {
    operator_delete(local_238[0].data_);
  }
  if (local_1b8[0].data_ != (pointer)local_1b8[0].firstElement) {
    operator_delete(local_1b8[0].data_);
  }
  if (local_160[0].data_ != (pointer)local_160[0].firstElement) {
    operator_delete(local_160[0].data_);
  }
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  ::delete_((allocator_type)local_f8._136_8_,
            (table_arrays<std::pair<const_int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
             *)local_68);
  return (Expression *)expr;
}

Assistant:

Expression& StructuredAssignmentPatternExpression::forFixedArray(
    Compilation& comp, const StructuredAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, SourceRange sourceRange) {

    bool bad = false;
    const Expression* defaultSetter = nullptr;
    SmallMap<int32_t, const Expression*, 8> indexMap;
    SmallVector<IndexSetter, 4> indexSetters;
    SmallVector<TypeSetter, 4> typeSetters;

    for (auto item : syntax.items) {
        if (item->key->kind == SyntaxKind::DefaultPatternKeyExpression) {
            if (defaultSetter) {
                context.addDiag(diag::AssignmentPatternKeyDupDefault, item->key->sourceRange());
                bad = true;
            }
            defaultSetter = &selfDetermined(comp, *item->expr, context);
            bad |= defaultSetter->bad();
            continue;
        }

        // The key is either an array index or a data type setter.
        auto& keyExpr = Expression::bind(*item->key, context, ASTFlags::AllowDataType);
        if (keyExpr.bad()) {
            bad = true;
            continue;
        }

        if (keyExpr.kind == ExpressionKind::DataType) {
            const Type& typeKey = *keyExpr.type;
            if (typeKey.isSimpleType()) {
                auto& expr = bindRValue(typeKey, *item->expr, {}, context);
                typeSetters.emplace_back(TypeSetter{&typeKey, &expr});
                bad |= expr.bad();
            }
            else {
                context.addDiag(diag::AssignmentPatternKeyExpr, item->key->sourceRange());
                bad = true;
            }
        }
        else {
            auto index = bindArrayIndexSetter(context, keyExpr, elementType, *item->expr, indexMap,
                                              indexSetters);
            if (!index) {
                bad = true;
                continue;
            }

            if (!type.getFixedRange().containsPoint(*index)) {
                auto& diag = context.addDiag(diag::IndexValueInvalid, keyExpr.sourceRange);
                diag << *index;
                diag << type;
                bad = true;
            }
        }
    }

    SmallVector<const Expression*> elements;
    std::optional<const Expression*> cachedVal;
    auto arrayRange = type.getFixedRange();

    for (int32_t i = arrayRange.lower(); i <= arrayRange.upper(); i++) {
        // If we already have a setter for this index we don't have to do anything else.
        if (auto it = indexMap.find(i); it != indexMap.end()) {
            elements.push_back(it->second);
            continue;
        }

        if (!cachedVal) {
            cachedVal = matchElementValue(context, elementType, nullptr, syntax.sourceRange(),
                                          typeSetters, defaultSetter);
            if (!cachedVal.value()) {
                bad = true;
                break;
            }
        }

        elements.push_back(*cachedVal);
    }

    auto result = comp.emplace<StructuredAssignmentPatternExpression>(
        type, std::span<const MemberSetter>{}, typeSetters.copy(comp), indexSetters.copy(comp),
        defaultSetter, elements.copy(comp), sourceRange);

    if (bad)
        return badExpr(comp, result);

    return *result;
}